

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::BVHNIntersector1<4,_257,_true,_embree::avx2::VirtualCurveIntersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 (*pauVar7) [16];
  uint uVar8;
  undefined4 uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  vint4 ai;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vint4 ai_3;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vint4 ai_1;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vfloat4 a0;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 bi_3;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi;
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  ulong local_10a8;
  RayHit *local_10a0;
  Intersectors *local_1098;
  RayQueryContext *local_1090;
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined4 local_fd8;
  undefined4 uStack_fd4;
  undefined4 uStack_fd0;
  undefined4 uStack_fcc;
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1090 = context;
  local_1098 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar26 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
    auVar21 = vrsqrtss_avx(auVar26,auVar26);
    auVar19._0_4_ = auVar21._0_4_;
    local_fb8[0] = auVar19._0_4_ * 1.5 -
                   auVar26._0_4_ * 0.5 * auVar19._0_4_ * auVar19._0_4_ * auVar19._0_4_;
    local_fc8 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    uStack_fc4 = local_fc8;
    uStack_fc0 = local_fc8;
    uStack_fbc = local_fc8;
    local_fd8 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    uStack_fd4 = local_fd8;
    uStack_fd0 = local_fd8;
    uStack_fcc = local_fd8;
    auVar34._0_4_ = aVar1.x * local_fb8[0];
    auVar34._4_4_ = aVar1.y * local_fb8[0];
    auVar34._8_4_ = aVar1.z * local_fb8[0];
    auVar34._12_4_ = aVar1.field_3.w * local_fb8[0];
    auVar21 = vshufpd_avx(auVar34,auVar34,1);
    auVar26 = vmovshdup_avx(auVar34);
    auVar51._8_4_ = 0x80000000;
    auVar51._0_8_ = 0x8000000080000000;
    auVar51._12_4_ = 0x80000000;
    auVar40._12_4_ = 0;
    auVar40._0_12_ = ZEXT812(0);
    auVar40 = auVar40 << 0x20;
    auVar47 = vunpckhps_avx(auVar34,auVar40);
    auVar48 = vshufps_avx(auVar47,ZEXT416(auVar26._0_4_ ^ 0x80000000),0x41);
    auVar47._0_8_ = auVar21._0_8_ ^ 0x8000000080000000;
    auVar47._8_8_ = auVar51._8_8_ ^ auVar21._8_8_;
    auVar47 = vinsertps_avx(auVar47,auVar34,0x2a);
    auVar26 = vdpps_avx(auVar48,auVar48,0x7f);
    auVar21 = vdpps_avx(auVar47,auVar47,0x7f);
    auVar26 = vcmpps_avx(auVar21,auVar26,1);
    auVar52._0_4_ = auVar26._0_4_;
    auVar52._4_4_ = auVar52._0_4_;
    auVar52._8_4_ = auVar52._0_4_;
    auVar52._12_4_ = auVar52._0_4_;
    auVar26 = vblendvps_avx(auVar47,auVar48,auVar52);
    auVar21 = vdpps_avx(auVar26,auVar26,0x7f);
    local_fe8 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fStack_fe4 = local_fe8;
    fStack_fe0 = local_fe8;
    fStack_fdc = local_fe8;
    auVar47 = vrsqrtss_avx(auVar21,auVar21);
    auVar19._0_4_ = auVar47._0_4_;
    auVar19._0_4_ =
         auVar19._0_4_ * 1.5 - auVar21._0_4_ * 0.5 * auVar19._0_4_ * auVar19._0_4_ * auVar19._0_4_;
    auVar48._0_4_ = auVar19._0_4_ * auVar26._0_4_;
    auVar48._4_4_ = auVar19._0_4_ * auVar26._4_4_;
    auVar48._8_4_ = auVar19._0_4_ * auVar26._8_4_;
    auVar48._12_4_ = auVar19._0_4_ * auVar26._12_4_;
    auVar26 = vshufps_avx(auVar48,auVar48,0xc9);
    auVar21 = vshufps_avx(auVar34,auVar34,0xc9);
    auVar54._0_4_ = auVar21._0_4_ * auVar48._0_4_;
    auVar54._4_4_ = auVar21._4_4_ * auVar48._4_4_;
    auVar54._8_4_ = auVar21._8_4_ * auVar48._8_4_;
    auVar54._12_4_ = auVar21._12_4_ * auVar48._12_4_;
    auVar26 = vfmsub231ps_fma(auVar54,auVar34,auVar26);
    auVar47 = vshufps_avx(auVar26,auVar26,0xc9);
    auVar26 = vdpps_avx(auVar47,auVar47,0x7f);
    auVar21 = vrsqrtss_avx(auVar26,auVar26);
    auVar19._0_4_ = auVar21._0_4_;
    auVar19._0_4_ =
         auVar19._0_4_ * 1.5 - auVar26._0_4_ * 0.5 * auVar19._0_4_ * auVar19._0_4_ * auVar19._0_4_;
    auVar21._0_4_ = auVar47._0_4_ * auVar19._0_4_;
    auVar21._4_4_ = auVar47._4_4_ * auVar19._0_4_;
    auVar21._8_4_ = auVar47._8_4_ * auVar19._0_4_;
    auVar21._12_4_ = auVar47._12_4_ * auVar19._0_4_;
    auVar26._0_4_ = local_fb8[0] * auVar34._0_4_;
    auVar26._4_4_ = local_fb8[0] * auVar34._4_4_;
    auVar26._8_4_ = local_fb8[0] * auVar34._8_4_;
    auVar26._12_4_ = local_fb8[0] * auVar34._12_4_;
    auVar47 = vunpcklps_avx(auVar48,auVar26);
    auVar26 = vunpckhps_avx(auVar48,auVar26);
    auVar48 = vunpcklps_avx(auVar21,auVar40);
    auVar21 = vunpckhps_avx(auVar21,auVar40);
    local_f88 = vunpcklps_avx(auVar26,auVar21);
    local_fa8 = vunpcklps_avx(auVar47,auVar48);
    local_f98 = vunpckhps_avx(auVar47,auVar48);
    pauVar16 = (undefined1 (*) [16])local_f68;
    auVar47 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar48 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    uStack_f70 = 0;
    local_ff8._8_4_ = 0x7fffffff;
    local_ff8._0_8_ = 0x7fffffff7fffffff;
    local_ff8._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx((undefined1  [16])aVar1,local_ff8);
    auVar41._8_4_ = 0x219392ef;
    auVar41._0_8_ = 0x219392ef219392ef;
    auVar41._12_4_ = 0x219392ef;
    auVar26 = vcmpps_avx(auVar26,auVar41,1);
    auVar42._8_4_ = 0x3f800000;
    auVar42._0_8_ = 0x3f8000003f800000;
    auVar42._12_4_ = 0x3f800000;
    auVar21 = vdivps_avx(auVar42,(undefined1  [16])aVar1);
    auVar43._8_4_ = 0x5d5e0b6b;
    auVar43._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar43._12_4_ = 0x5d5e0b6b;
    auVar26 = vblendvps_avx(auVar21,auVar43,auVar26);
    auVar35._0_4_ = auVar26._0_4_ * 0.99999964;
    auVar35._4_4_ = auVar26._4_4_ * 0.99999964;
    auVar35._8_4_ = auVar26._8_4_ * 0.99999964;
    auVar35._12_4_ = auVar26._12_4_ * 0.99999964;
    auVar19._0_4_ = auVar26._0_4_ * 1.0000004;
    auVar19._4_4_ = auVar26._4_4_ * 1.0000004;
    auVar19._8_4_ = auVar26._8_4_ * 1.0000004;
    auVar19._12_4_ = auVar26._12_4_ * 1.0000004;
    local_1008._4_4_ = auVar35._0_4_;
    local_1008._0_4_ = auVar35._0_4_;
    local_1008._8_4_ = auVar35._0_4_;
    local_1008._12_4_ = auVar35._0_4_;
    auVar50 = ZEXT1664(local_1008);
    auVar26 = vmovshdup_avx(auVar35);
    local_1018 = vshufps_avx(auVar35,auVar35,0x55);
    auVar53 = ZEXT1664(local_1018);
    uVar15 = (ulong)(auVar35._0_4_ < 0.0) << 4;
    auVar21 = vshufpd_avx(auVar35,auVar35,1);
    local_1028 = vshufps_avx(auVar35,auVar35,0xaa);
    auVar56 = ZEXT1664(local_1028);
    uVar17 = (ulong)(auVar26._0_4_ < 0.0) << 4 | 0x20;
    local_1048 = vshufps_avx(auVar19,auVar19,0x55);
    auVar60 = ZEXT1664(local_1048);
    local_1058 = vshufps_avx(auVar19,auVar19,0xaa);
    auVar62 = ZEXT1664(local_1058);
    uVar18 = (ulong)(auVar21._0_4_ < 0.0) << 4 | 0x40;
    uVar13 = uVar15 ^ 0x10;
    uVar9 = auVar47._0_4_;
    local_1068._4_4_ = uVar9;
    local_1068._0_4_ = uVar9;
    local_1068._8_4_ = uVar9;
    local_1068._12_4_ = uVar9;
    auVar63 = ZEXT1664(local_1068);
    uVar9 = auVar48._0_4_;
    auVar20 = ZEXT1664(CONCAT412(uVar9,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))));
    uVar9 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_1078._4_4_ = uVar9;
    local_1078._0_4_ = uVar9;
    local_1078._8_4_ = uVar9;
    local_1078._12_4_ = uVar9;
    auVar65 = ZEXT1664(local_1078);
    uVar9 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_1088._4_4_ = uVar9;
    local_1088._0_4_ = uVar9;
    local_1088._8_4_ = uVar9;
    local_1088._12_4_ = uVar9;
    auVar67 = ZEXT1664(local_1088);
    uVar9 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_10b8._4_4_ = uVar9;
    local_10b8._0_4_ = uVar9;
    local_10b8._8_4_ = uVar9;
    local_10b8._12_4_ = uVar9;
    auVar46 = ZEXT1664(local_10b8);
    local_10a0 = ray;
    local_10a8 = uVar15;
    local_1038 = auVar19._0_4_;
    fStack_1034 = auVar19._0_4_;
    fStack_1030 = auVar19._0_4_;
    fStack_102c = auVar19._0_4_;
    fVar57 = auVar19._0_4_;
    fVar58 = auVar19._0_4_;
    fVar59 = auVar19._0_4_;
    do {
      pauVar7 = pauVar16 + -1;
      pauVar16 = pauVar16 + -1;
      if (*(float *)(*pauVar7 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar11 = *(ulong *)*pauVar16;
LAB_0191cc2b:
        if ((uVar11 & 0xf) == 0) {
          auVar26 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + uVar15),auVar65._0_16_);
          auVar22._0_4_ = auVar50._0_4_ * auVar26._0_4_;
          auVar22._4_4_ = auVar50._4_4_ * auVar26._4_4_;
          auVar22._8_4_ = auVar50._8_4_ * auVar26._8_4_;
          auVar22._12_4_ = auVar50._12_4_ * auVar26._12_4_;
          auVar26 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + uVar17),auVar67._0_16_);
          auVar27._0_4_ = auVar53._0_4_ * auVar26._0_4_;
          auVar27._4_4_ = auVar53._4_4_ * auVar26._4_4_;
          auVar27._8_4_ = auVar53._8_4_ * auVar26._8_4_;
          auVar27._12_4_ = auVar53._12_4_ * auVar26._12_4_;
          auVar26 = vmaxps_avx(auVar22,auVar27);
          auVar21 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + uVar18),auVar46._0_16_);
          auVar28._0_4_ = auVar56._0_4_ * auVar21._0_4_;
          auVar28._4_4_ = auVar56._4_4_ * auVar21._4_4_;
          auVar28._8_4_ = auVar56._8_4_ * auVar21._8_4_;
          auVar28._12_4_ = auVar56._12_4_ * auVar21._12_4_;
          auVar21 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + uVar13),auVar65._0_16_);
          auVar31._0_4_ = auVar19._0_4_ * auVar21._0_4_;
          auVar31._4_4_ = fVar57 * auVar21._4_4_;
          auVar31._8_4_ = fVar58 * auVar21._8_4_;
          auVar31._12_4_ = fVar59 * auVar21._12_4_;
          auVar21 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + (uVar17 ^ 0x10)),
                               auVar67._0_16_);
          auVar36._0_4_ = auVar60._0_4_ * auVar21._0_4_;
          auVar36._4_4_ = auVar60._4_4_ * auVar21._4_4_;
          auVar36._8_4_ = auVar60._8_4_ * auVar21._8_4_;
          auVar36._12_4_ = auVar60._12_4_ * auVar21._12_4_;
          auVar47 = vminps_avx(auVar31,auVar36);
          auVar21 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + (uVar18 ^ 0x10)),
                               auVar46._0_16_);
          auVar37._0_4_ = auVar62._0_4_ * auVar21._0_4_;
          auVar37._4_4_ = auVar62._4_4_ * auVar21._4_4_;
          auVar37._8_4_ = auVar62._8_4_ * auVar21._8_4_;
          auVar37._12_4_ = auVar62._12_4_ * auVar21._12_4_;
          auVar21 = vmaxps_avx(auVar28,auVar63._0_16_);
          local_10c8 = vmaxps_avx(auVar26,auVar21);
          auVar26 = vminps_avx(auVar37,auVar20._0_16_);
          auVar26 = vminps_avx(auVar47,auVar26);
          auVar26 = vcmpps_avx(local_10c8,auVar26,2);
          uVar8 = vmovmskps_avx(auVar26);
          uVar10 = (ulong)uVar8;
        }
        else {
          if ((int)(uVar11 & 0xf) != 2) {
            (**(code **)((long)local_1098->leafIntersector +
                        (ulong)*(byte *)(uVar11 & 0xfffffffffffffff0) * 0x40))
                      (local_fb8,ray,local_1090);
            auVar19._0_4_ = (local_10a0->super_RayK<1>).tfar;
            auVar20 = ZEXT1664(CONCAT412(auVar19._0_4_,
                                         CONCAT48(auVar19._0_4_,
                                                  CONCAT44(auVar19._0_4_,auVar19._0_4_))));
            auVar50 = ZEXT1664(local_1008);
            auVar53 = ZEXT1664(local_1018);
            auVar56 = ZEXT1664(local_1028);
            auVar60 = ZEXT1664(local_1048);
            auVar62 = ZEXT1664(local_1058);
            auVar63 = ZEXT1664(local_1068);
            auVar65 = ZEXT1664(local_1078);
            auVar67 = ZEXT1664(local_1088);
            auVar46 = ZEXT1664(local_10b8);
            ray = local_10a0;
            uVar15 = local_10a8;
            auVar19._0_4_ = local_1038;
            fVar57 = fStack_1034;
            fVar58 = fStack_1030;
            fVar59 = fStack_102c;
            goto LAB_0191d15c;
          }
          uVar10 = uVar11 & 0xfffffffffffffff0;
          auVar26 = *(undefined1 (*) [16])(uVar10 + 0x80);
          auVar49._0_4_ = local_fe8 * auVar26._0_4_;
          auVar49._4_4_ = fStack_fe4 * auVar26._4_4_;
          auVar49._8_4_ = fStack_fe0 * auVar26._8_4_;
          auVar49._12_4_ = fStack_fdc * auVar26._12_4_;
          auVar21 = *(undefined1 (*) [16])(uVar10 + 0x90);
          auVar55._0_4_ = local_fe8 * auVar21._0_4_;
          auVar55._4_4_ = fStack_fe4 * auVar21._4_4_;
          auVar55._8_4_ = fStack_fe0 * auVar21._8_4_;
          auVar55._12_4_ = fStack_fdc * auVar21._12_4_;
          auVar47 = *(undefined1 (*) [16])(uVar10 + 0xa0);
          auVar61._0_4_ = local_fe8 * auVar47._0_4_;
          auVar61._4_4_ = fStack_fe4 * auVar47._4_4_;
          auVar61._8_4_ = fStack_fe0 * auVar47._8_4_;
          auVar61._12_4_ = fStack_fdc * auVar47._12_4_;
          auVar5._4_4_ = uStack_fd4;
          auVar5._0_4_ = local_fd8;
          auVar5._8_4_ = uStack_fd0;
          auVar5._12_4_ = uStack_fcc;
          auVar48 = vfmadd231ps_fma(auVar49,auVar5,*(undefined1 (*) [16])(uVar10 + 0x50));
          auVar40 = vfmadd231ps_fma(auVar55,auVar5,*(undefined1 (*) [16])(uVar10 + 0x60));
          auVar19 = vfmadd231ps_fma(auVar61,auVar5,*(undefined1 (*) [16])(uVar10 + 0x70));
          auVar6._4_4_ = uStack_fc4;
          auVar6._0_4_ = local_fc8;
          auVar6._8_4_ = uStack_fc0;
          auVar6._12_4_ = uStack_fbc;
          auVar34 = vfmadd231ps_fma(auVar48,auVar6,*(undefined1 (*) [16])(uVar10 + 0x20));
          auVar35 = vfmadd231ps_fma(auVar40,auVar6,*(undefined1 (*) [16])(uVar10 + 0x30));
          auVar41 = vfmadd231ps_fma(auVar19,auVar6,*(undefined1 (*) [16])(uVar10 + 0x40));
          auVar48 = vandps_avx(local_ff8,auVar34);
          auVar66._8_4_ = 0x219392ef;
          auVar66._0_8_ = 0x219392ef219392ef;
          auVar66._12_4_ = 0x219392ef;
          auVar48 = vcmpps_avx(auVar48,auVar66,1);
          auVar40 = vblendvps_avx(auVar34,auVar66,auVar48);
          auVar48 = vandps_avx(auVar35,local_ff8);
          auVar48 = vcmpps_avx(auVar48,auVar66,1);
          auVar19 = vblendvps_avx(auVar35,auVar66,auVar48);
          auVar48 = vandps_avx(auVar41,local_ff8);
          auVar48 = vcmpps_avx(auVar48,auVar66,1);
          auVar48 = vblendvps_avx(auVar41,auVar66,auVar48);
          auVar34 = vrcpps_avx(auVar40);
          auVar64._8_4_ = 0x3f800000;
          auVar64._0_8_ = 0x3f8000003f800000;
          auVar64._12_4_ = 0x3f800000;
          auVar40 = vfnmadd213ps_fma(auVar40,auVar34,auVar64);
          auVar34 = vfmadd132ps_fma(auVar40,auVar34,auVar34);
          auVar40 = vrcpps_avx(auVar19);
          auVar19 = vfnmadd213ps_fma(auVar19,auVar40,auVar64);
          auVar19 = vfmadd132ps_fma(auVar19,auVar40,auVar40);
          auVar40 = vrcpps_avx(auVar48);
          auVar48 = vfnmadd213ps_fma(auVar48,auVar40,auVar64);
          auVar48 = vfmadd132ps_fma(auVar48,auVar40,auVar40);
          auVar26 = vfmadd213ps_fma(auVar26,local_10b8,*(undefined1 (*) [16])(uVar10 + 0xb0));
          auVar21 = vfmadd213ps_fma(auVar21,local_10b8,*(undefined1 (*) [16])(uVar10 + 0xc0));
          auVar67 = ZEXT1664(local_1088);
          auVar40 = vfmadd231ps_fma(auVar26,local_1088,*(undefined1 (*) [16])(uVar10 + 0x50));
          auVar21 = vfmadd231ps_fma(auVar21,local_1088,*(undefined1 (*) [16])(uVar10 + 0x60));
          auVar26 = vfmadd213ps_fma(auVar47,local_10b8,*(undefined1 (*) [16])(uVar10 + 0xd0));
          auVar26 = vfmadd231ps_fma(auVar26,local_1088,*(undefined1 (*) [16])(uVar10 + 0x70));
          auVar65 = ZEXT1664(local_1078);
          auVar47 = vfmadd231ps_fma(auVar40,local_1078,*(undefined1 (*) [16])(uVar10 + 0x20));
          auVar32._0_4_ = auVar47._0_4_ * -auVar34._0_4_;
          auVar32._4_4_ = auVar47._4_4_ * -auVar34._4_4_;
          auVar32._8_4_ = auVar47._8_4_ * -auVar34._8_4_;
          auVar32._12_4_ = auVar47._12_4_ * -auVar34._12_4_;
          auVar21 = vfmadd231ps_fma(auVar21,local_1078,*(undefined1 (*) [16])(uVar10 + 0x30));
          auVar29._0_4_ = auVar21._0_4_ * -auVar19._0_4_;
          auVar29._4_4_ = auVar21._4_4_ * -auVar19._4_4_;
          auVar29._8_4_ = auVar21._8_4_ * -auVar19._8_4_;
          auVar29._12_4_ = auVar21._12_4_ * -auVar19._12_4_;
          auVar26 = vfmadd231ps_fma(auVar26,local_1078,*(undefined1 (*) [16])(uVar10 + 0x40));
          auVar23._0_4_ = auVar26._0_4_ * -auVar48._0_4_;
          auVar23._4_4_ = auVar26._4_4_ * -auVar48._4_4_;
          auVar23._8_4_ = auVar26._8_4_ * -auVar48._8_4_;
          auVar23._12_4_ = auVar26._12_4_ * -auVar48._12_4_;
          auVar38._0_4_ = auVar34._0_4_ + auVar32._0_4_;
          auVar38._4_4_ = auVar34._4_4_ + auVar32._4_4_;
          auVar38._8_4_ = auVar34._8_4_ + auVar32._8_4_;
          auVar38._12_4_ = auVar34._12_4_ + auVar32._12_4_;
          auVar44._0_4_ = auVar19._0_4_ + auVar29._0_4_;
          auVar44._4_4_ = auVar19._4_4_ + auVar29._4_4_;
          auVar44._8_4_ = auVar19._8_4_ + auVar29._8_4_;
          auVar44._12_4_ = auVar19._12_4_ + auVar29._12_4_;
          auVar45._0_4_ = auVar48._0_4_ + auVar23._0_4_;
          auVar45._4_4_ = auVar48._4_4_ + auVar23._4_4_;
          auVar45._8_4_ = auVar48._8_4_ + auVar23._8_4_;
          auVar45._12_4_ = auVar48._12_4_ + auVar23._12_4_;
          auVar26 = vpminsd_avx(auVar29,auVar44);
          auVar21 = vpminsd_avx(auVar23,auVar45);
          auVar26 = vmaxps_avx(auVar26,auVar21);
          auVar40 = vpminsd_avx(auVar32,auVar38);
          auVar48 = vpmaxsd_avx(auVar32,auVar38);
          auVar21 = vpmaxsd_avx(auVar29,auVar44);
          auVar47 = vpmaxsd_avx(auVar23,auVar45);
          auVar46 = ZEXT1664(local_10b8);
          auVar47 = vminps_avx(auVar21,auVar47);
          auVar63 = ZEXT1664(local_1068);
          auVar21 = vmaxps_avx(local_1068,auVar40);
          auVar26 = vmaxps_avx(auVar21,auVar26);
          auVar21 = vminps_avx(auVar20._0_16_,auVar48);
          auVar21 = vminps_avx(auVar21,auVar47);
          local_10c8._0_4_ = auVar26._0_4_ * 0.99999964;
          local_10c8._4_4_ = auVar26._4_4_ * 0.99999964;
          local_10c8._8_4_ = auVar26._8_4_ * 0.99999964;
          local_10c8._12_4_ = auVar26._12_4_ * 0.99999964;
          auVar24._0_4_ = auVar21._0_4_ * 1.0000004;
          auVar24._4_4_ = auVar21._4_4_ * 1.0000004;
          auVar24._8_4_ = auVar21._8_4_ * 1.0000004;
          auVar24._12_4_ = auVar21._12_4_ * 1.0000004;
          auVar26 = vcmpps_avx(local_10c8,auVar24,2);
          uVar9 = vmovmskps_avx(auVar26);
          uVar10 = CONCAT44((int)(uVar10 >> 0x20),uVar9);
          auVar50 = ZEXT1664(local_1008);
          auVar53 = ZEXT1664(local_1018);
          auVar56 = ZEXT1664(local_1028);
          auVar60 = ZEXT1664(local_1048);
          auVar62 = ZEXT1664(local_1058);
          auVar19._0_4_ = local_1038;
          fVar57 = fStack_1034;
          fVar58 = fStack_1030;
          fVar59 = fStack_102c;
        }
        if (uVar10 == 0) goto LAB_0191d15c;
        uVar12 = uVar11 & 0xfffffffffffffff0;
        lVar4 = 0;
        for (uVar11 = uVar10; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
          lVar4 = lVar4 + 1;
        }
        uVar8 = (uint)uVar10 - 1 & (uint)uVar10;
        uVar10 = (ulong)uVar8;
        uVar11 = *(ulong *)(uVar12 + lVar4 * 8);
        if (uVar8 != 0) {
          uVar2 = *(uint *)(local_10c8 + lVar4 * 4);
          lVar4 = 0;
          for (; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
            lVar4 = lVar4 + 1;
          }
          uVar8 = uVar8 - 1 & uVar8;
          uVar14 = (ulong)uVar8;
          uVar10 = *(ulong *)(uVar12 + lVar4 * 8);
          uVar3 = *(uint *)(local_10c8 + lVar4 * 4);
          if (uVar8 == 0) {
            if (uVar2 < uVar3) {
              *(ulong *)*pauVar16 = uVar10;
              *(uint *)(*pauVar16 + 8) = uVar3;
              pauVar16 = pauVar16 + 1;
            }
            else {
              *(ulong *)*pauVar16 = uVar11;
              *(uint *)(*pauVar16 + 8) = uVar2;
              uVar11 = uVar10;
              pauVar16 = pauVar16 + 1;
            }
          }
          else {
            auVar25._8_8_ = 0;
            auVar25._0_8_ = uVar11;
            auVar26 = vpunpcklqdq_avx(auVar25,ZEXT416(uVar2));
            auVar30._8_8_ = 0;
            auVar30._0_8_ = uVar10;
            auVar21 = vpunpcklqdq_avx(auVar30,ZEXT416(uVar3));
            lVar4 = 0;
            for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
              lVar4 = lVar4 + 1;
            }
            uVar8 = uVar8 - 1 & uVar8;
            uVar11 = (ulong)uVar8;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = *(ulong *)(uVar12 + lVar4 * 8);
            auVar47 = vpunpcklqdq_avx(auVar33,ZEXT416(*(uint *)(local_10c8 + lVar4 * 4)));
            if (uVar8 == 0) {
              auVar48 = vpcmpgtd_avx(auVar21,auVar26);
              auVar40 = vpshufd_avx(auVar48,0xaa);
              auVar48 = vblendvps_avx(auVar21,auVar26,auVar40);
              auVar26 = vblendvps_avx(auVar26,auVar21,auVar40);
              auVar21 = vpcmpgtd_avx(auVar47,auVar48);
              auVar40 = vpshufd_avx(auVar21,0xaa);
              auVar21 = vblendvps_avx(auVar47,auVar48,auVar40);
              auVar47 = vblendvps_avx(auVar48,auVar47,auVar40);
              auVar48 = vpcmpgtd_avx(auVar47,auVar26);
              auVar40 = vpshufd_avx(auVar48,0xaa);
              auVar48 = vblendvps_avx(auVar47,auVar26,auVar40);
              auVar26 = vblendvps_avx(auVar26,auVar47,auVar40);
              *pauVar16 = auVar26;
              pauVar16[1] = auVar48;
              uVar11 = auVar21._0_8_;
              pauVar16 = pauVar16 + 2;
            }
            else {
              lVar4 = 0;
              for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                lVar4 = lVar4 + 1;
              }
              auVar39._8_8_ = 0;
              auVar39._0_8_ = *(ulong *)(uVar12 + lVar4 * 8);
              auVar34 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_10c8 + lVar4 * 4)));
              auVar48 = vpcmpgtd_avx(auVar21,auVar26);
              auVar40 = vpshufd_avx(auVar48,0xaa);
              auVar48 = vblendvps_avx(auVar21,auVar26,auVar40);
              auVar26 = vblendvps_avx(auVar26,auVar21,auVar40);
              auVar21 = vpcmpgtd_avx(auVar34,auVar47);
              auVar40 = vpshufd_avx(auVar21,0xaa);
              auVar21 = vblendvps_avx(auVar34,auVar47,auVar40);
              auVar47 = vblendvps_avx(auVar47,auVar34,auVar40);
              auVar40 = vpcmpgtd_avx(auVar47,auVar26);
              auVar34 = vpshufd_avx(auVar40,0xaa);
              auVar40 = vblendvps_avx(auVar47,auVar26,auVar34);
              auVar26 = vblendvps_avx(auVar26,auVar47,auVar34);
              auVar47 = vpcmpgtd_avx(auVar21,auVar48);
              auVar34 = vpshufd_avx(auVar47,0xaa);
              auVar47 = vblendvps_avx(auVar21,auVar48,auVar34);
              auVar21 = vblendvps_avx(auVar48,auVar21,auVar34);
              auVar48 = vpcmpgtd_avx(auVar40,auVar21);
              auVar34 = vpshufd_avx(auVar48,0xaa);
              auVar48 = vblendvps_avx(auVar40,auVar21,auVar34);
              auVar21 = vblendvps_avx(auVar21,auVar40,auVar34);
              *pauVar16 = auVar26;
              pauVar16[1] = auVar21;
              pauVar16[2] = auVar48;
              auVar46 = ZEXT1664(local_10b8);
              uVar11 = auVar47._0_8_;
              pauVar16 = pauVar16 + 3;
            }
          }
        }
        goto LAB_0191cc2b;
      }
LAB_0191d15c:
    } while (pauVar16 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }